

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpCallother::printRaw(TypeOpCallother *this,ostream *s,PcodeOp *op)

{
  PcodeOp *pPVar1;
  int4 iVar2;
  Varnode *pVVar3;
  int local_50;
  int4 i;
  string local_40 [32];
  PcodeOp *local_20;
  PcodeOp *op_local;
  ostream *s_local;
  TypeOpCallother *this_local;
  
  local_20 = op;
  op_local = (PcodeOp *)s;
  s_local = (ostream *)this;
  pVVar3 = PcodeOp::getOut(op);
  if (pVVar3 != (Varnode *)0x0) {
    pVVar3 = PcodeOp::getOut(local_20);
    Varnode::printRaw(pVVar3,(ostream *)op_local);
    std::operator<<((ostream *)op_local," = ");
  }
  pPVar1 = op_local;
  (*(this->super_TypeOp)._vptr_TypeOp[0xb])(local_40,this,local_20);
  std::operator<<((ostream *)pPVar1,local_40);
  std::__cxx11::string::~string(local_40);
  iVar2 = PcodeOp::numInput(local_20);
  if (1 < iVar2) {
    std::operator<<((ostream *)op_local,'(');
    pVVar3 = PcodeOp::getIn(local_20,1);
    Varnode::printRaw(pVVar3,(ostream *)op_local);
    local_50 = 2;
    while( true ) {
      iVar2 = PcodeOp::numInput(local_20);
      if (iVar2 <= local_50) break;
      std::operator<<((ostream *)op_local,',');
      pVVar3 = PcodeOp::getIn(local_20,local_50);
      Varnode::printRaw(pVVar3,(ostream *)op_local);
      local_50 = local_50 + 1;
    }
    std::operator<<((ostream *)op_local,')');
  }
  return;
}

Assistant:

void TypeOpCallother::printRaw(ostream &s,const PcodeOp *op)

{
  if (op->getOut() != (Varnode *)0) {
    op->getOut()->printRaw(s);
    s << " = ";
  }
  s << getOperatorName(op);
  if (op->numInput()>1) {
    s << '(';
    op->getIn(1)->printRaw(s);
    for(int4 i=2;i<op->numInput();++i) {
      s << ',';
      op->getIn(i)->printRaw(s);
    }
    s << ')';
  }
}